

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTree::childAt(QAccessibleTree *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QTreeViewPrivate *this_00;
  QModelIndex *_index;
  QWidget *this_01;
  QHeaderView *pQVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  int column;
  int row;
  QTreeView *treeView;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  QPoint indexPosition;
  QPoint viewportOffset;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  QModelIndex *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QAccessibleTable *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QAccessibleInterface *local_68;
  undefined1 local_60 [24];
  QModelIndex local_48;
  QPoint local_28;
  QPoint local_20 [2];
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTreeViewPrivate *)QAccessibleTable::view((QAccessibleTable *)0x7f70c8);
  if (this_00 == (QTreeViewPrivate *)0x0) {
    local_68 = (QAccessibleInterface *)0x0;
  }
  else {
    _index = (QModelIndex *)QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff30)
    ;
    if (_index == (QModelIndex *)0x0) {
      local_68 = (QAccessibleInterface *)0x0;
    }
    else {
      local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff18);
      local_10 = QWidget::mapTo(this_01,(QWidget *)
                                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),(QPoint *)in_stack_ffffffffffffff30);
      local_20[0] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff18);
      local_28 = ::operator-((QPoint *)in_stack_ffffffffffffff30,
                             (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                            );
      local_20[0] = QWidget::mapFromGlobal
                              ((QWidget *)in_stack_ffffffffffffff30,
                               (QPoint *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate + 0x1f0))(&local_48,this_00,local_20);
      bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
      if (bVar1) {
        qobject_cast<QTreeView_const*>((QObject *)0x7f7242);
        QTreeView::d_func((QTreeView *)0x7f7251);
        iVar2 = QTreeViewPrivate::viewIndex(this_00,_index);
        pQVar5 = QAccessibleTable::horizontalHeader(in_stack_ffffffffffffff30);
        iVar2 = iVar2 + (uint)(pQVar5 != (QHeaderView *)0x0);
        iVar3 = QModelIndex::column(&local_48);
        QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff20);
        iVar4 = (**(code **)(*(long *)_index + 0x80))(_index,local_60);
        local_68 = (QAccessibleInterface *)
                   (**(code **)(*in_RDI + 0x100))(in_RDI,iVar2 * iVar4 + iVar3);
      }
      else {
        local_68 = (QAccessibleInterface *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_68;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTree::childAt(int x, int y) const
{
    const QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    const QPoint viewportOffset = theView->viewport()->mapTo(theView, QPoint(0, 0));
    const QPoint indexPosition = theView->mapFromGlobal(QPoint(x, y) - viewportOffset);

    const QModelIndex index = theView->indexAt(indexPosition);
    if (!index.isValid())
        return nullptr;

    const QTreeView *treeView = qobject_cast<const QTreeView *>(theView);
    int row = treeView->d_func()->viewIndex(index) + (horizontalHeader() ? 1 : 0);
    int column = index.column();

    int i = row * theModel->columnCount(theView->rootIndex()) + column;
    return child(i);
}